

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_pulse.c
# Opt level: O1

int pulse_stream_init(cubeb_conflict *context,cubeb_stream_conflict **stream,char *stream_name,
                     cubeb_devid input_device,cubeb_stream_params *input_stream_params,
                     cubeb_devid output_device,cubeb_stream_params *output_stream_params,
                     uint latency_frames,cubeb_data_callback_conflict data_callback,
                     cubeb_state_callback_conflict state_callback,void *user_ptr)

{
  uint32_t uVar1;
  undefined3 uVar2;
  int iVar3;
  int iVar4;
  cubeb_stream_conflict *stm;
  pa_sample_spec *ppVar5;
  pa_operation *ppVar6;
  pa_buffer_attr *ppVar7;
  pa_buffer_attr local_58;
  pa_buffer_attr local_44;
  
  if ((context->error == 1) && (iVar3 = pulse_context_init(context), iVar3 != 0)) {
    return -1;
  }
  *stream = (cubeb_stream_conflict *)0x0;
  stm = (cubeb_stream_conflict *)calloc(1,0x60);
  stm->context = context;
  stm->data_callback = data_callback;
  stm->state_callback = state_callback;
  stm->user_ptr = user_ptr;
  stm->volume = -1.0;
  stm->state = ~CUBEB_STATE_STARTED;
  (*cubeb_pa_threaded_mainloop_lock)(context->mainloop);
  if (output_stream_params != (cubeb_stream_params *)0x0) {
    iVar3 = create_pa_stream(stm,&stm->output_stream,output_stream_params,stream_name);
    if (iVar3 != 0) goto LAB_0011a90b;
    ppVar5 = (*cubeb_pa_stream_get_sample_spec)(stm->output_stream);
    uVar1 = ppVar5->rate;
    (stm->output_sample_spec).format = ppVar5->format;
    (stm->output_sample_spec).rate = uVar1;
    uVar2 = *(undefined3 *)&ppVar5->field_0x9;
    (stm->output_sample_spec).channels = ppVar5->channels;
    *(undefined3 *)&(stm->output_sample_spec).field_0x9 = uVar2;
    (*cubeb_pa_stream_set_state_callback)(stm->output_stream,stream_state_callback,stm);
    (*cubeb_pa_stream_set_write_callback)(stm->output_stream,stream_write_callback,stm);
    set_buffering_attribute(&local_58,latency_frames,&stm->output_sample_spec);
    (*cubeb_pa_stream_connect_playback)
              (stm->output_stream,(char *)output_device,&local_58,
               PA_STREAM_ADJUST_LATENCY|PA_STREAM_AUTO_TIMING_UPDATE|PA_STREAM_INTERPOLATE_TIMING|
               PA_STREAM_START_CORKED,(pa_cvolume *)0x0,(pa_stream *)0x0);
  }
  if (input_stream_params != (cubeb_stream_params *)0x0) {
    iVar3 = create_pa_stream(stm,&stm->input_stream,input_stream_params,stream_name);
    if (iVar3 != 0) {
LAB_0011a90b:
      (*cubeb_pa_threaded_mainloop_unlock)(stm->context->mainloop);
      pulse_stream_destroy(stm);
      return iVar3;
    }
    ppVar5 = (*cubeb_pa_stream_get_sample_spec)(stm->input_stream);
    uVar1 = ppVar5->rate;
    (stm->input_sample_spec).format = ppVar5->format;
    (stm->input_sample_spec).rate = uVar1;
    uVar2 = *(undefined3 *)&ppVar5->field_0x9;
    (stm->input_sample_spec).channels = ppVar5->channels;
    *(undefined3 *)&(stm->input_sample_spec).field_0x9 = uVar2;
    (*cubeb_pa_stream_set_state_callback)(stm->input_stream,stream_state_callback,stm);
    (*cubeb_pa_stream_set_read_callback)(stm->input_stream,stream_read_callback,stm);
    set_buffering_attribute(&local_44,latency_frames,&stm->input_sample_spec);
    local_58.fragsize = local_44.fragsize;
    local_58.maxlength = local_44.maxlength;
    local_58.tlength = local_44.tlength;
    local_58.prebuf = local_44.prebuf;
    local_58.minreq = local_44.minreq;
    (*cubeb_pa_stream_connect_record)
              (stm->input_stream,(char *)input_device,&local_58,
               PA_STREAM_ADJUST_LATENCY|PA_STREAM_AUTO_TIMING_UPDATE|PA_STREAM_INTERPOLATE_TIMING|
               PA_STREAM_START_CORKED);
  }
  if (((stm->output_stream != (pa_stream *)0x0) &&
      (iVar3 = wait_until_io_stream_ready(stm->output_stream,stm->context->mainloop), iVar3 == -1))
     || ((stm->input_stream != (pa_stream *)0x0 &&
         (iVar3 = wait_until_io_stream_ready(stm->input_stream,stm->context->mainloop), iVar3 == -1)
         ))) {
    (*cubeb_pa_threaded_mainloop_unlock)(stm->context->mainloop);
    goto LAB_0011aa8a;
  }
  if (stm->output_stream == (pa_stream *)0x0) {
    iVar3 = -1;
LAB_0011aa3e:
    if ((stm->input_stream != (pa_stream *)0x0) &&
       (ppVar6 = (*cubeb_pa_stream_update_timing_info)
                           (stm->input_stream,stream_success_callback,stm),
       ppVar6 != (pa_operation *)0x0)) {
      iVar3 = operation_wait(stm->context,stm->input_stream,ppVar6);
      (*cubeb_pa_operation_unref)(ppVar6);
    }
  }
  else {
    ppVar6 = (*cubeb_pa_stream_update_timing_info)(stm->output_stream,stream_success_callback,stm);
    iVar3 = -1;
    if (ppVar6 != (pa_operation *)0x0) {
      iVar4 = operation_wait(stm->context,stm->output_stream,ppVar6);
      (*cubeb_pa_operation_unref)(ppVar6);
      if (iVar4 == 0) {
        iVar3 = 0;
        goto LAB_0011aa3e;
      }
    }
  }
  (*cubeb_pa_threaded_mainloop_unlock)(stm->context->mainloop);
  if (iVar3 == 0) {
    if (g_cubeb_log_level != CUBEB_LOG_DISABLED) {
      if (((output_stream_params != (cubeb_stream_params *)0x0) &&
          (ppVar7 = (*cubeb_pa_stream_get_buffer_attr)(stm->output_stream),
          g_cubeb_log_callback != (cubeb_log_callback)0x0)) &&
         (g_cubeb_log_level != CUBEB_LOG_DISABLED)) {
        (*g_cubeb_log_callback)
                  ("%s:%d: Output buffer attributes maxlength %u, tlength %u, prebuf %u, minreq %u, fragsize %u\n"
                   ,"cubeb_pulse.c",0x3d9,(ulong)ppVar7->maxlength,(ulong)ppVar7->tlength,
                   (ulong)ppVar7->prebuf,(ulong)ppVar7->minreq,(ulong)ppVar7->fragsize);
      }
      if (((input_stream_params != (cubeb_stream_params *)0x0) &&
          (ppVar7 = (*cubeb_pa_stream_get_buffer_attr)(stm->input_stream),
          g_cubeb_log_callback != (cubeb_log_callback)0x0)) &&
         (g_cubeb_log_level != CUBEB_LOG_DISABLED)) {
        (*g_cubeb_log_callback)
                  ("%s:%d: Input buffer attributes maxlength %u, tlength %u, prebuf %u, minreq %u, fragsize %u\n"
                   ,"cubeb_pulse.c",0x3e0,(ulong)ppVar7->maxlength,(ulong)ppVar7->tlength,
                   (ulong)ppVar7->prebuf,(ulong)ppVar7->minreq,(ulong)ppVar7->fragsize);
      }
    }
    *stream = stm;
    if (g_cubeb_log_callback == (cubeb_log_callback)0x0) {
      return 0;
    }
    if (g_cubeb_log_level == CUBEB_LOG_DISABLED) {
      return 0;
    }
    (*g_cubeb_log_callback)("%s:%d: Cubeb stream (%p) init successful.\n","cubeb_pulse.c",0x3e5,stm)
    ;
    return 0;
  }
LAB_0011aa8a:
  pulse_stream_destroy(stm);
  return -1;
}

Assistant:

static int
pulse_stream_init(cubeb * context,
                  cubeb_stream ** stream,
                  char const * stream_name,
                  cubeb_devid input_device,
                  cubeb_stream_params * input_stream_params,
                  cubeb_devid output_device,
                  cubeb_stream_params * output_stream_params,
                  unsigned int latency_frames,
                  cubeb_data_callback data_callback,
                  cubeb_state_callback state_callback,
                  void * user_ptr)
{
  cubeb_stream * stm;
  pa_buffer_attr battr;
  int r;

  assert(context);

  // If the connection failed for some reason, try to reconnect
  if (context->error == 1 && pulse_context_init(context) != 0) {
    return CUBEB_ERROR;
  }

  *stream = NULL;

  stm = calloc(1, sizeof(*stm));
  assert(stm);

  stm->context = context;
  stm->data_callback = data_callback;
  stm->state_callback = state_callback;
  stm->user_ptr = user_ptr;
  stm->volume = PULSE_NO_GAIN;
  stm->state = -1;
  assert(stm->shutdown == 0);

  WRAP(pa_threaded_mainloop_lock)(stm->context->mainloop);
  if (output_stream_params) {
    r = create_pa_stream(stm, &stm->output_stream, output_stream_params, stream_name);
    if (r != CUBEB_OK) {
      WRAP(pa_threaded_mainloop_unlock)(stm->context->mainloop);
      pulse_stream_destroy(stm);
      return r;
    }

    stm->output_sample_spec = *(WRAP(pa_stream_get_sample_spec)(stm->output_stream));

    WRAP(pa_stream_set_state_callback)(stm->output_stream, stream_state_callback, stm);
    WRAP(pa_stream_set_write_callback)(stm->output_stream, stream_write_callback, stm);

    battr = set_buffering_attribute(latency_frames, &stm->output_sample_spec);
    WRAP(pa_stream_connect_playback)(stm->output_stream,
                                     (char const *) output_device,
                                     &battr,
                                     PA_STREAM_AUTO_TIMING_UPDATE | PA_STREAM_INTERPOLATE_TIMING |
                                     PA_STREAM_START_CORKED | PA_STREAM_ADJUST_LATENCY,
                                     NULL, NULL);
  }

  // Set up input stream
  if (input_stream_params) {
    r = create_pa_stream(stm, &stm->input_stream, input_stream_params, stream_name);
    if (r != CUBEB_OK) {
      WRAP(pa_threaded_mainloop_unlock)(stm->context->mainloop);
      pulse_stream_destroy(stm);
      return r;
    }

    stm->input_sample_spec = *(WRAP(pa_stream_get_sample_spec)(stm->input_stream));

    WRAP(pa_stream_set_state_callback)(stm->input_stream, stream_state_callback, stm);
    WRAP(pa_stream_set_read_callback)(stm->input_stream, stream_read_callback, stm);

    battr = set_buffering_attribute(latency_frames, &stm->input_sample_spec);
    WRAP(pa_stream_connect_record)(stm->input_stream,
                                   (char const *) input_device,
                                   &battr,
                                   PA_STREAM_AUTO_TIMING_UPDATE | PA_STREAM_INTERPOLATE_TIMING |
                                   PA_STREAM_START_CORKED | PA_STREAM_ADJUST_LATENCY);
  }

  r = wait_until_stream_ready(stm);
  if (r == 0) {
    /* force a timing update now, otherwise timing info does not become valid
       until some point after initialization has completed. */
    r = stream_update_timing_info(stm);
  }

  WRAP(pa_threaded_mainloop_unlock)(stm->context->mainloop);

  if (r != 0) {
    pulse_stream_destroy(stm);
    return CUBEB_ERROR;
  }

  if (g_cubeb_log_level) {
    if (output_stream_params){
      const pa_buffer_attr * output_att;
      output_att = WRAP(pa_stream_get_buffer_attr)(stm->output_stream);
      LOG("Output buffer attributes maxlength %u, tlength %u, prebuf %u, minreq %u, fragsize %u",output_att->maxlength, output_att->tlength,
          output_att->prebuf, output_att->minreq, output_att->fragsize);
    }

    if (input_stream_params){
      const pa_buffer_attr * input_att;
      input_att = WRAP(pa_stream_get_buffer_attr)(stm->input_stream);
      LOG("Input buffer attributes maxlength %u, tlength %u, prebuf %u, minreq %u, fragsize %u",input_att->maxlength, input_att->tlength,
          input_att->prebuf, input_att->minreq, input_att->fragsize);
    }
  }

  *stream = stm;
  LOG("Cubeb stream (%p) init successful.", *stream);

  return CUBEB_OK;
}